

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

Node * __thiscall rengine::TestBase::update(TestBase *this,Node *root)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  StaticRenderTest *pSVar3;
  int iVar4;
  undefined4 extraout_var;
  
  if (root != (Node *)0x0) {
    (*(root->super_SignalEmitter)._vptr_SignalEmitter[2])(root);
  }
  p_Var2 = (this->tests).
           super__List_base<rengine::StaticRenderTest_*,_std::allocator<rengine::StaticRenderTest_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->tests) {
    this->m_currentTest = (StaticRenderTest *)p_Var2[1]._M_next;
    psVar1 = &(this->tests).
              super__List_base<rengine::StaticRenderTest_*,_std::allocator<rengine::StaticRenderTest_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2);
    pSVar3 = this->m_currentTest;
    pSVar3->m_surface = (Surface *)this;
    iVar4 = (**pSVar3->_vptr_StaticRenderTest)();
    return (Node *)CONCAT44(extraout_var,iVar4);
  }
  return (Node *)0x0;
}

Assistant:

Node *update(Node *root) override {
        if (root)
            root->destroy();

        if (tests.empty())
            return 0;

        m_currentTest = tests.front();
        tests.pop_front();

        m_currentTest->setSurface(this);

        return m_currentTest->build();
    }